

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexjson.h
# Opt level: O0

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_0000003c;
  json_object *__return_storage_ptr__;
  json_deserializer local_40;
  void *local_18;
  string *value_local;
  
  __return_storage_ptr__ = (json_object *)CONCAT44(in_register_0000003c,__fd);
  local_18 = __buf;
  value_local = (string *)__return_storage_ptr__;
  json_deserializer::json_deserializer(&local_40,(string *)__buf);
  json_deserializer::deserialize(__return_storage_ptr__,&local_40);
  json_deserializer::~json_deserializer(&local_40);
  return (ssize_t)__return_storage_ptr__;
}

Assistant:

json_object read(string value) {
    return json_deserializer(value).deserialize();
}